

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bencode.hpp
# Opt level: O0

int __thiscall
libtorrent::aux::bencode_visitor<char_*>::operator()(bencode_visitor<char_*> *this,list_type *l)

{
  bool bVar1;
  __visit_result_t<libtorrent::aux::bencode_visitor<char_*>_&,_const_std::variant<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>_&>
  _Var2;
  variant<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
  *__variants;
  entry *i;
  const_iterator __end3;
  const_iterator __begin3;
  list_type *__range3;
  int ret;
  list_type *l_local;
  bencode_visitor<char_*> *this_local;
  
  write_char<char*>(this->out,'l');
  __range3._4_4_ = 2;
  __end3 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::begin(l);
  i = (entry *)::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::end(l);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_libtorrent::entry_*,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                                *)&i);
    if (!bVar1) break;
    __variants = &__gnu_cxx::
                  __normal_iterator<const_libtorrent::entry_*,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                  ::operator*(&__end3)->super_variant_type;
    _Var2 = ::std::
            visit<libtorrent::aux::bencode_visitor<char*>&,std::variant<long,std::__cxx11::string,std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>,boost::container::map<std::__cxx11::string,libtorrent::entry,libtorrent::aux::strview_less,void,void>,std::vector<char,std::allocator<char>>,libtorrent::entry_types::uninitialized_type>const&>
                      (this,__variants);
    __range3._4_4_ = _Var2 + __range3._4_4_;
    __gnu_cxx::
    __normal_iterator<const_libtorrent::entry_*,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
    ::operator++(&__end3);
  }
  write_char<char*>(this->out,'e');
  return __range3._4_4_;
}

Assistant:

int operator()(entry::list_type const& l)
		{
			write_char(out, 'l');
			int ret = 2;
			for (auto const& i : l)
				ret += std::visit(*this, static_cast<entry::variant_type const&>(i));
			write_char(out, 'e');
			return ret;
		}